

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalWatcomWMakeGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalWatcomWMakeGenerator::PrintBuildCommandAdvice
          (cmGlobalWatcomWMakeGenerator *this,ostream *os,int jobs)

{
  if (jobs != -1) {
    std::__ostream_insert<char,std::char_traits<char>>
              (os,
               "Warning: Watcom\'s WMake does not support parallel builds. Ignoring parallel build command line option.\n"
               ,0x67);
  }
  cmGlobalGenerator::PrintBuildCommandAdvice((cmGlobalGenerator *)this,os,-1);
  return;
}

Assistant:

void cmGlobalWatcomWMakeGenerator::PrintBuildCommandAdvice(std::ostream& os,
                                                           int jobs) const
{
  if (jobs != cmake::NO_BUILD_PARALLEL_LEVEL) {
    // wmake does not support parallel build level

    /* clang-format off */
    os <<
      "Warning: Watcom's WMake does not support parallel builds. "
      "Ignoring parallel build command line option.\n";
    /* clang-format on */
  }

  this->cmGlobalUnixMakefileGenerator3::PrintBuildCommandAdvice(
    os, cmake::NO_BUILD_PARALLEL_LEVEL);
}